

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void __thiscall google::LogMessage::~LogMessage(LogMessage *this)

{
  LogMessageData *this_00;
  long *in_FS_OFFSET;
  LogMessage *this_local;
  
  Flush(this);
  if (this->data_ == (LogMessageData *)(*in_FS_OFFSET + -0x7728)) {
    LogMessageData::~LogMessageData(this->data_);
    *(undefined1 *)(*in_FS_OFFSET + -0x7730) = 1;
  }
  else {
    this_00 = this->allocated_;
    if (this_00 != (LogMessageData *)0x0) {
      LogMessageData::~LogMessageData(this_00);
      operator_delete(this_00,0x7728);
    }
  }
  return;
}

Assistant:

LogMessage::~LogMessage() {
  Flush();
#ifdef GLOG_THREAD_LOCAL_STORAGE
  if (data_ == static_cast<void*>(&thread_msg_data)) {
    data_->~LogMessageData();
    thread_data_available = true;
  }
  else {
    delete allocated_;
  }
#else // !defined(GLOG_THREAD_LOCAL_STORAGE)
  delete allocated_;
#endif // defined(GLOG_THREAD_LOCAL_STORAGE)
}